

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O2

void Am_Widget_General_Undo_Redo(Am_Object *command_obj,bool undo,bool selective)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *this;
  Am_Object widget;
  Am_Object inter;
  Am_Object local_48;
  Am_Value old_value;
  Am_Value new_value;
  
  new_value.type = 0;
  new_value.value.wrapper_value = (Am_Wrapper *)0x0;
  old_value.type = 0;
  old_value.value.wrapper_value = (Am_Wrapper *)0x0;
  inter.data = (Am_Object_Data *)0x0;
  widget.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&inter,pAVar2);
  bVar1 = Am_Object::Valid(&inter);
  if (bVar1) {
    Am_Object::Get_Owner(&local_48,(Am_Slot_Flags)&inter);
    Am_Object::operator=(&widget,&local_48);
    Am_Object::~Am_Object(&local_48);
  }
  this = command_obj;
  if (selective) {
    bVar1 = Am_Object::Valid(&widget);
    this = &widget;
    if (!bVar1) goto LAB_00234304;
  }
  pAVar2 = Am_Object::Get(this,0x169,1);
  Am_Value::operator=(&new_value,pAVar2);
LAB_00234304:
  pAVar2 = Am_Object::Get(command_obj,(ushort)undo + (ushort)undo * 2 + 0x169,1);
  Am_Value::operator=(&old_value,pAVar2);
  Am_Object::Set(command_obj,0x16c,&new_value,0);
  Am_Object::Set(command_obj,0x169,&old_value,0);
  bVar1 = Am_Object::Valid(&widget);
  if (bVar1) {
    Am_Object::Set(&widget,0x16c,&new_value,1);
    Am_Object::Set(&widget,0x169,&old_value,0);
  }
  Am_Object::~Am_Object(&widget);
  Am_Object::~Am_Object(&inter);
  Am_Value::~Am_Value(&old_value);
  Am_Value::~Am_Value(&new_value);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Widget_Inter_Command_Selective_Undo,
                 (Am_Object command_obj))
{
  Am_Widget_General_Undo_Redo(command_obj, true, true);
}